

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O0

string * path_to_varname_abi_cxx11_(char *path)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  char *name;
  char *lastslash;
  string *varname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  allocator<char> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  pcVar1 = strrchr((char *)in_RSI,0x2f);
  local_50 = in_RSI;
  if (pcVar1 != (char *)0x0) {
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pcVar1 + 1);
  }
  uVar2 = 0;
  this = local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT17(uVar2,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffde);
  std::__cxx11::string::c_str();
  sanitize_name((char *)local_50);
  return in_RDI;
}

Assistant:

static std::string path_to_varname(const char* path)
{
    const char* lastslash = strrchr(path, '/');
    const char* name = lastslash == NULL ? path : lastslash + 1;

    std::string varname = name;
    sanitize_name((char*)varname.c_str());

    return varname;
}